

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall asl::Array<asl::String>::alloc(Array<asl::String> *this,int m)

{
  int *piVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = 3;
  if (3 < m) {
    uVar4 = (ulong)(uint)m;
  }
  piVar1 = (int *)malloc(uVar4 * 0x18 + 0x10);
  if (piVar1 != (int *)0x0) {
    this->_a = (String *)(piVar1 + 4);
    piVar1[1] = (int)uVar4;
    *piVar1 = m;
    piVar1[2] = 1;
    if (m != 0) {
      lVar3 = 0;
      do {
        *(undefined1 *)((long)piVar1 + lVar3 + 0x18) = 0;
        *(undefined8 *)((long)&((String *)(piVar1 + 4))->_size + lVar3) = 0;
        lVar3 = lVar3 + 0x18;
      } while ((long)m * 0x18 != lVar3);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = dup2;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void Array<T>::alloc(int m)
{
	int s=max(m, 3);
	char* p = (char*) malloc( s*sizeof(T)+sizeof(Data) );
	if(!p)
		ASL_BAD_ALLOC();
	_a = (T*) ( p + sizeof(Data) );
	ASL_RC_INIT();
	d().s = s;
	d().n = m;
	d().rc=1;
	asl_construct(_a, m);
}